

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O0

void __thiscall
OpenMD::OplsTorsionType::OplsTorsionType
          (OplsTorsionType *this,RealType v1,RealType v2,RealType v3,bool trans180)

{
  PolynomialTorsionType *in_RDI;
  _func_int **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  RealType c3;
  RealType c2;
  RealType c1;
  RealType c0;
  int in_stack_ffffffffffffff9c;
  PolynomialTorsionType *in_stack_ffffffffffffffb0;
  
  PolynomialTorsionType::PolynomialTorsionType(in_stack_ffffffffffffffb0);
  (in_RDI->super_TorsionType)._vptr_TorsionType = (_func_int **)&PTR__OplsTorsionType_00511c38;
  in_RDI[1].super_TorsionType._vptr_TorsionType = in_XMM0_Qa;
  *(undefined8 *)&in_RDI[1].polynomial_.polyPairMap_._M_t._M_impl = in_XMM1_Qa;
  *(undefined8 *)&in_RDI[1].polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header =
       in_XMM2_Qa;
  PolynomialTorsionType::setCoefficient(in_RDI,in_stack_ffffffffffffff9c,1.82817085261489e-317);
  PolynomialTorsionType::setCoefficient(in_RDI,in_stack_ffffffffffffff9c,1.82818221612474e-317);
  PolynomialTorsionType::setCoefficient(in_RDI,in_stack_ffffffffffffff9c,1.82819357963459e-317);
  PolynomialTorsionType::setCoefficient(in_RDI,in_stack_ffffffffffffff9c,1.82820494314445e-317);
  return;
}

Assistant:

OplsTorsionType(RealType v1, RealType v2, RealType v3, bool trans180) :
        PolynomialTorsionType(), v1_(v1), v2_(v2), v3_(v3) {
      // convert OPLS Torsion Type to Polynomial Torsion type
      RealType c0 = v2 + 0.5 * (v1 + v3);
      RealType c1 = 0.5 * (v1 - 3.0 * v3);
      RealType c2 = -v2;
      RealType c3 = 2.0 * v3;

      if (!trans180) {
        c1 = -c1;
        c3 = -c3;
      }

      setCoefficient(0, c0);
      setCoefficient(1, c1);
      setCoefficient(2, c2);
      setCoefficient(3, c3);
    }